

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

bool __thiscall CCoinsViewCache::Sync(CCoinsViewCache *this)

{
  CCoinsView *pCVar1;
  int iVar2;
  logic_error *this_00;
  long in_FS_OFFSET;
  CoinsViewCacheCursor cursor;
  size_t *local_38;
  CoinsCachePair *local_30;
  CCoinsMap *local_28;
  undefined1 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &this->cachedCoinsUsage;
  local_28 = &this->cacheCoins;
  local_20 = 0;
  pCVar1 = (this->super_CCoinsViewBacked).base;
  local_30 = &this->m_sentinel;
  iVar2 = (*pCVar1->_vptr_CCoinsView[4])(pCVar1,&local_38,&this->hashBlock);
  if ((SUB41(iVar2,0) == false) || ((this->m_sentinel).second.m_next == &this->m_sentinel)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return SUB41(iVar2,0);
    }
  }
  else {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Not all unspent flagged entries were cleared");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::Sync()
{
    auto cursor{CoinsViewCacheCursor(cachedCoinsUsage, m_sentinel, cacheCoins, /*will_erase=*/false)};
    bool fOk = base->BatchWrite(cursor, hashBlock);
    if (fOk) {
        if (m_sentinel.second.Next() != &m_sentinel) {
            /* BatchWrite must clear flags of all entries */
            throw std::logic_error("Not all unspent flagged entries were cleared");
        }
    }
    return fOk;
}